

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O0

void cmsysMD5_Append(cmsysMD5 *md5,uchar *data,int length)

{
  undefined8 local_28;
  size_t dlen;
  int length_local;
  uchar *data_local;
  cmsysMD5 *md5_local;
  
  if (length < 0) {
    local_28 = strlen((char *)data);
  }
  else {
    local_28 = (size_t)length;
  }
  md5_append(&md5->md5_state,data,local_28);
  return;
}

Assistant:

void kwsysMD5_Append(kwsysMD5* md5, unsigned char const* data, int length)
{
  size_t dlen;
  if (length < 0) {
    dlen = strlen((char const*)data);
  } else {
    dlen = (size_t)length;
  }
  md5_append(&md5->md5_state, (md5_byte_t const*)data, dlen);
}